

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.tab.hh
# Opt level: O1

void __thiscall
tchecker::parsing::system::parser_t::basic_symbol<tchecker::parsing::system::parser_t::by_state>::
clear(basic_symbol<tchecker::parsing::system::parser_t::by_state> *this)

{
  int iVar1;
  long lVar2;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<tchecker::parsing::attr_t>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<tchecker::parsing::attr_t>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
  *this_00;
  vector<std::shared_ptr<tchecker::parsing::sync_constraint_t>,_std::allocator<std::shared_ptr<tchecker::parsing::sync_constraint_t>_>_>
  *this_01;
  
  lVar2 = (long)(this->super_by_state).state;
  if (lVar2 == 0) {
    iVar1 = -2;
  }
  else {
    iVar1 = (int)(char)yystos_[lVar2];
  }
  switch(iVar1) {
  case 0xc:
  case 0xe:
  case 0x13:
  case 0x1d:
    value_type::destroy<std::__cxx11::string>(&this->value);
  default:
    goto switchD_001e00a1_caseD_d;
  case 0x1a:
  case 0x1b:
    this_00 = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<tchecker::parsing::attr_t>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<tchecker::parsing::attr_t>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
               *)value_type::as<tchecker::parsing::attributes_t>(&this->value);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<tchecker::parsing::attr_t>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<tchecker::parsing::attr_t>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
    ::~_Hashtable(this_00);
    break;
  case 0x1c:
    value_type::destroy<std::shared_ptr<tchecker::parsing::attr_t>>(&this->value);
    goto switchD_001e00a1_caseD_d;
  case 0x1e:
    this_01 = value_type::
              as<std::vector<std::shared_ptr<tchecker::parsing::sync_constraint_t>,std::allocator<std::shared_ptr<tchecker::parsing::sync_constraint_t>>>>
                        (&this->value);
    std::
    vector<std::shared_ptr<tchecker::parsing::sync_constraint_t>,_std::allocator<std::shared_ptr<tchecker::parsing::sync_constraint_t>_>_>
    ::~vector(this_01);
    break;
  case 0x1f:
    value_type::destroy<std::shared_ptr<tchecker::parsing::sync_constraint_t>>(&this->value);
    goto switchD_001e00a1_caseD_d;
  case 0x20:
    value_type::as<tchecker::sync_strength_t>(&this->value);
    break;
  case 0x23:
    value_type::as<int>(&this->value);
    break;
  case 0x24:
    value_type::as<unsigned_int>(&this->value);
  }
  (this->value).yytypeid_ = (type_info *)0x0;
switchD_001e00a1_caseD_d:
  (this->super_by_state).state = '\0';
  return;
}

Assistant:

void clear () YY_NOEXCEPT
      {
        // User destructor.
        symbol_kind_type yykind = this->kind ();
        basic_symbol<Base>& yysym = *this;
        (void) yysym;
        switch (yykind)
        {
       default:
          break;
        }

        // Value type destructor.
switch (yykind)
    {
      case symbol_kind::S_sync_strength: // sync_strength
        value.template destroy< enum tchecker::sync_strength_t > ();
        break;

      case symbol_kind::S_attr: // attr
        value.template destroy< std::shared_ptr<tchecker::parsing::attr_t> > ();
        break;

      case symbol_kind::S_sync_constraint: // sync_constraint
        value.template destroy< std::shared_ptr<tchecker::parsing::sync_constraint_t> > ();
        break;

      case symbol_kind::S_TOK_ID: // "identifier"
      case symbol_kind::S_TOK_INTEGER: // "integer value"
      case symbol_kind::S_TOK_TEXT: // "text value"
      case symbol_kind::S_text_or_empty: // text_or_empty
        value.template destroy< std::string > ();
        break;

      case symbol_kind::S_sync_constraint_list: // sync_constraint_list
        value.template destroy< std::vector<std::shared_ptr<tchecker::parsing::sync_constraint_t>> > ();
        break;

      case symbol_kind::S_integer: // integer
        value.template destroy< tchecker::integer_t > ();
        break;

      case symbol_kind::S_attr_list: // attr_list
      case symbol_kind::S_non_empty_attr_list: // non_empty_attr_list
        value.template destroy< tchecker::parsing::attributes_t > ();
        break;

      case symbol_kind::S_uinteger: // uinteger
        value.template destroy< unsigned int > ();
        break;

      default:
        break;
    }

        Base::clear ();
      }